

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char c)

{
  QTextStreamPrivate *this_00;
  QChar ch;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    QMessageLogger::warning(&local_30,"QTextStream: No device");
  }
  else {
    ch.ucs._1_1_ = 0;
    ch.ucs._0_1_ = c;
    QTextStreamPrivate::putChar(this_00,ch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(char c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putChar(QChar::fromLatin1(c));
    return *this;
}